

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkUpdateNetwork(Abc_ShaMan_t *p,int fAnd)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  Abc_Obj_t *pAVar5;
  uint *__ptr;
  void *pvVar6;
  uint *__ptr_00;
  Abc_Obj_t *pAVar7;
  void *pvVar8;
  Vec_Ptr_t *pVVar9;
  Abc_Ntk_t *pAVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  long lVar21;
  
  pAVar5 = Abc_AigConst1(p->pNtk);
  uVar1 = *(uint *)(((ulong)pAVar5 & 0xfffffffffffffffe) + 0x10);
  if ((int)uVar1 < 0) {
LAB_002c6ced:
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  uVar4 = p->nStartCols;
  __ptr = (uint *)malloc(0x10);
  uVar18 = 8;
  if (6 < uVar4 - 1) {
    uVar18 = (ulong)uVar4;
  }
  __ptr[1] = 0;
  uVar17 = (uint)uVar18;
  *__ptr = uVar17;
  if (uVar17 == 0) {
    pvVar6 = (void *)0x0;
  }
  else {
    pvVar6 = malloc((long)(int)uVar17 * 8);
  }
  *(void **)(__ptr + 2) = pvVar6;
  __ptr_00 = (uint *)malloc(0x10);
  __ptr_00[1] = 0;
  *__ptr_00 = uVar17;
  if (uVar17 == 0) {
    pvVar6 = (void *)0x0;
  }
  else {
    pvVar6 = malloc((long)(int)uVar17 << 3);
  }
  uVar12 = 0;
  *(void **)(__ptr_00 + 2) = pvVar6;
  if (0 < (int)uVar4) {
    uVar11 = 0;
    uVar19 = uVar18;
    do {
      if ((long)p->vObj2Lit->nSize <= (long)uVar11) goto LAB_002c6caf;
      uVar4 = p->vObj2Lit->pArray[uVar11];
      if (fAnd == 0) {
        if ((int)uVar4 < 0) {
LAB_002c6c90:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        pVVar9 = p->pNtk->vObjs;
        if (pVVar9->nSize <= (int)(uVar4 >> 1)) goto LAB_002c6c52;
        pvVar6 = pVVar9->pArray[uVar4 >> 1];
        pAVar7 = Abc_AigConst1(p->pNtk);
        pAVar7 = (Abc_Obj_t *)((ulong)(~uVar4 & 1) ^ (ulong)pAVar7);
      }
      else {
        if ((int)uVar4 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x130,"int Abc_LitIsCompl(int)");
        }
        if ((uVar4 & 1) != 0) {
          __assert_fail("!fAnd || !Abc_LitIsCompl(iLit)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExtract.c"
                        ,0x263,"Abc_Ntk_t *Abc_NtkUpdateNetwork(Abc_ShaMan_t *, int)");
        }
        pVVar9 = p->pNtk->vObjs;
        if (pVVar9->nSize <= (int)(uVar4 >> 1)) goto LAB_002c6c52;
        pvVar6 = pVVar9->pArray[uVar4 >> 1];
        pAVar7 = Abc_AigConst1(p->pNtk);
      }
      iVar20 = (int)uVar11;
      iVar16 = (int)uVar18;
      if (iVar20 == iVar16) {
        if (iVar16 < 0x10) {
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar8 = malloc(0x80);
          }
          else {
            pvVar8 = realloc(*(void **)(__ptr + 2),0x80);
          }
          *(void **)(__ptr + 2) = pvVar8;
          *__ptr = 0x10;
          uVar18 = 0x10;
        }
        else {
          uVar18 = (ulong)(uint)(iVar16 * 2);
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar8 = malloc(uVar18 * 8);
          }
          else {
            pvVar8 = realloc(*(void **)(__ptr + 2),uVar18 * 8);
          }
          *(void **)(__ptr + 2) = pvVar8;
          *__ptr = iVar16 * 2;
        }
      }
      else {
        pvVar8 = *(void **)(__ptr + 2);
      }
      __ptr[1] = iVar20 + 1;
      *(void **)((long)pvVar8 + uVar11 * 8) = pvVar6;
      iVar16 = (int)uVar19;
      if (iVar20 == iVar16) {
        if (iVar16 < 0x10) {
          if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
            pvVar6 = malloc(0x80);
          }
          else {
            pvVar6 = realloc(*(void **)(__ptr_00 + 2),0x80);
          }
          *(void **)(__ptr_00 + 2) = pvVar6;
          *__ptr_00 = 0x10;
          uVar19 = 0x10;
        }
        else {
          uVar19 = (ulong)(uint)(iVar16 * 2);
          if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
            pvVar6 = malloc(uVar19 * 8);
          }
          else {
            pvVar6 = realloc(*(void **)(__ptr_00 + 2),uVar19 * 8);
          }
          *(void **)(__ptr_00 + 2) = pvVar6;
          *__ptr_00 = iVar16 * 2;
        }
      }
      else {
        pvVar6 = *(void **)(__ptr_00 + 2);
      }
      uVar12 = uVar11 + 1;
      __ptr_00[1] = (uint)uVar12;
      *(Abc_Obj_t **)((long)pvVar6 + uVar11 * 8) = pAVar7;
      p->nCountGates = p->nCountGates + -1;
      uVar11 = uVar12;
    } while ((long)uVar12 < (long)p->nStartCols);
  }
  pVVar9 = p->vBuckets;
  if (0 < pVVar9->nSize) {
    lVar14 = 0;
    do {
      pvVar6 = pVVar9->pArray[lVar14];
      iVar16 = *(int *)((long)pvVar6 + 4);
      if (0 < iVar16) {
        lVar21 = 0;
        do {
          lVar2 = *(long *)(*(long *)((long)pvVar6 + 8) + lVar21 * 8);
          if (2 < *(int *)(lVar2 + 4)) {
            lVar13 = 2;
            do {
              uVar4 = (*(uint **)(lVar2 + 8))[lVar13];
              if (p->vObj2Lit->nSize <= (int)uVar4) {
                __assert_fail("ObjId < Vec_IntSize(p->vObj2Lit)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExtract.c"
                              ,0x278,"Abc_Ntk_t *Abc_NtkUpdateNetwork(Abc_ShaMan_t *, int)");
              }
              if (p->nStartCols <= (int)uVar4) break;
              if (((int)uVar4 < 0) || ((int)uVar12 <= (int)uVar4)) goto LAB_002c6c52;
              uVar17 = **(uint **)(lVar2 + 8);
              lVar3 = *(long *)(__ptr_00 + 2);
              pAVar7 = *(Abc_Obj_t **)(lVar3 + (ulong)uVar4 * 8);
              pAVar10 = p->pNtk;
              if (fAnd == 0) {
                if ((int)uVar17 < 0) goto LAB_002c6c90;
                if (pAVar10->vObjs->nSize <= (int)(uVar17 >> 1)) goto LAB_002c6c52;
                pAVar7 = Abc_AigXor((Abc_Aig_t *)pAVar10->pManFunc,pAVar7,
                                    (Abc_Obj_t *)
                                    ((ulong)(uVar17 & 1) ^
                                    (ulong)pAVar10->vObjs->pArray[uVar17 >> 1]));
              }
              else {
                if ((int)uVar17 < 0) goto LAB_002c6c90;
                if (pAVar10->vObjs->nSize <= (int)(uVar17 >> 1)) goto LAB_002c6c52;
                pAVar7 = Abc_AigAnd((Abc_Aig_t *)pAVar10->pManFunc,pAVar7,
                                    (Abc_Obj_t *)
                                    ((ulong)(uVar17 & 1) ^
                                    (ulong)pAVar10->vObjs->pArray[uVar17 >> 1]));
              }
              *(Abc_Obj_t **)(lVar3 + (ulong)uVar4 * 8) = pAVar7;
              p->nCountGates = p->nCountGates + 1;
              lVar13 = lVar13 + 1;
            } while (lVar13 < *(int *)(lVar2 + 4));
            iVar16 = *(int *)((long)pvVar6 + 4);
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 < iVar16);
        pVVar9 = p->vBuckets;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < pVVar9->nSize);
  }
  if (p->fVerbose != 0) {
    printf("Total gates collected = %d.  Total gates constructed = %d.\n",
           (ulong)(uint)p->nFoundGates,(ulong)(uint)p->nCountGates);
  }
  iVar16 = p->pNtk->vObjs->nSize;
  iVar20 = 0x10;
  if (0xe < iVar16 - 1U) {
    iVar20 = iVar16;
  }
  if ((iVar20 == 0) || (pvVar6 = malloc((long)iVar20 << 2), pvVar6 == (void *)0x0)) {
    pvVar6 = (void *)0x0;
  }
  else {
    memset(pvVar6,0xff,(long)iVar16 * 4);
  }
  pvVar8 = *(void **)(__ptr + 2);
  if ((int)uVar12 < 1) {
    if (pvVar8 == (void *)0x0) goto LAB_002c6a77;
  }
  else {
    uVar18 = 0;
    do {
      if ((uVar12 & 0xffffffff) == uVar18) {
LAB_002c6c52:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar11 = *(ulong *)(*(long *)(__ptr_00 + 2) + uVar18 * 8);
      iVar20 = *(int *)((uVar11 & 0xfffffffffffffffe) + 0x10);
      if (iVar20 < 0) goto LAB_002c6ced;
      uVar4 = *(uint *)(*(long *)((long)pvVar8 + uVar18 * 8) + 0x10);
      if (((int)uVar4 < 0) || (iVar16 <= (int)uVar4)) goto LAB_002c6cce;
      *(uint *)((long)pvVar6 + (ulong)uVar4 * 4) = ((uint)uVar11 & 1) + iVar20 * 2;
      uVar18 = uVar18 + 1;
    } while ((uVar12 & 0xffffffff) != uVar18);
  }
  free(pvVar8);
LAB_002c6a77:
  free(__ptr);
  if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
    free(*(void **)(__ptr_00 + 2));
  }
  free(__ptr_00);
  pAVar10 = p->pNtk;
  pVVar9 = pAVar10->vObjs;
  if (0 < pVVar9->nSize) {
    uVar4 = ((uint)pAVar5 & 1) + uVar1 * 2;
    lVar14 = 0;
    do {
      pvVar8 = pVVar9->pArray[lVar14];
      if (pvVar8 != (void *)0x0) {
        uVar17 = *(uint *)((long)pvVar8 + 0x14);
        if (((uVar17 & 0xf) < 8) && ((0x98U >> (uVar17 & 0xf) & 1) != 0)) {
          uVar15 = **(uint **)((long)pvVar8 + 0x20);
          if (((long)(int)uVar15 < 0) || (iVar16 <= (int)uVar15)) {
LAB_002c6caf:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar15 = *(uint *)((long)pvVar6 + (long)(int)uVar15 * 4);
          if (-1 < (int)uVar15) {
            if ((fAnd == 0) || (uVar15 != uVar4)) {
              *(uint *)((long)pvVar8 + 0x14) = (uVar15 & 1) << 10 ^ uVar17;
              if (*(int *)((long)pvVar8 + 0x1c) < 1) {
LAB_002c6cce:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              uVar15 = uVar15 >> 1;
            }
            else {
              *(uint *)((long)pvVar8 + 0x14) = uVar17 ^ 0x400;
              uVar15 = uVar1;
              if (*(int *)((long)pvVar8 + 0x1c) < 1) goto LAB_002c6cce;
            }
            **(uint **)((long)pvVar8 + 0x20) = uVar15;
          }
        }
        uVar17 = *(uint *)((long)pvVar8 + 0x14);
        if ((uVar17 & 0xf) == 7) {
          iVar20 = *(int *)(*(long *)((long)pvVar8 + 0x20) + 4);
          if (((long)iVar20 < 0) || (iVar16 <= iVar20)) goto LAB_002c6caf;
          uVar15 = *(uint *)((long)pvVar6 + (long)iVar20 * 4);
          if (-1 < (int)uVar15) {
            if ((fAnd == 0) || (uVar15 != uVar4)) {
              *(uint *)((long)pvVar8 + 0x14) =
                   uVar17 & 0xfffff7f7 | (uVar15 << 0xb ^ uVar17) & 0x800;
              if (*(int *)((long)pvVar8 + 0x1c) < 2) goto LAB_002c6cce;
              uVar15 = uVar15 >> 1;
            }
            else {
              *(uint *)((long)pvVar8 + 0x14) = uVar17 ^ 0x800;
              uVar15 = uVar1;
              if (*(int *)((long)pvVar8 + 0x1c) < 2) goto LAB_002c6cce;
            }
            *(uint *)(*(long *)((long)pvVar8 + 0x20) + 4) = uVar15;
          }
        }
      }
      lVar14 = lVar14 + 1;
      pAVar10 = p->pNtk;
      pVVar9 = pAVar10->vObjs;
    } while (lVar14 < pVVar9->nSize);
  }
  if (pvVar6 != (void *)0x0) {
    free(pvVar6);
  }
  if (fAnd == 0) {
    pAVar10 = Abc_NtkBalanceExor(pAVar10,1,0);
    return pAVar10;
  }
  pAVar10 = Abc_NtkBalance(pAVar10,0,0,1);
  return pAVar10;
}

Assistant:

Abc_Ntk_t * Abc_NtkUpdateNetwork( Abc_ShaMan_t * p, int fAnd )
{
    Abc_Ntk_t * pNtk;
    Vec_Int_t * vInput, * vMap2Repl;
    Vec_Ptr_t * vOrig, * vRepl, * vBucket;
    Abc_Obj_t * pObj, * pNew;
    int i, j, k, ObjId, iLit;
    int iLitConst1 = Abc_ObjToLit( Abc_AigConst1(p->pNtk) );

    vOrig = Vec_PtrAlloc( p->nStartCols );
    vRepl = Vec_PtrAlloc( p->nStartCols );
    for ( i = 0; i < p->nStartCols; i++ )
    {
        iLit = Vec_IntEntry( p->vObj2Lit, i );
        assert( !fAnd || !Abc_LitIsCompl(iLit) );

        pObj = Abc_NtkObj( p->pNtk, Abc_Lit2Var(iLit) );

        if ( fAnd )
            pNew = Abc_AigConst1(p->pNtk);
        else
            pNew = Abc_ObjNotCond( Abc_AigConst1(p->pNtk), !Abc_LitIsCompl(iLit) );

        Vec_PtrPush( vOrig, pObj );
        Vec_PtrPush( vRepl, pNew );

        p->nCountGates--;
    }

    // go through the columns
    Vec_PtrForEachEntry( Vec_Ptr_t *, p->vBuckets, vBucket, i )
    Vec_PtrForEachEntry( Vec_Int_t *, vBucket, vInput, j )
    {
        Vec_IntForEachEntryStart( vInput, ObjId, k, SHARE_NUM )
        {
            assert( ObjId < Vec_IntSize(p->vObj2Lit) );
            if ( ObjId >= p->nStartCols )
                break;
            assert( ObjId < p->nStartCols );
            iLit = Vec_IntEntry( vInput, 0 );

            pNew = (Abc_Obj_t *)Vec_PtrEntry( vRepl, ObjId );
            if ( fAnd )
                pNew = Abc_AigAnd( (Abc_Aig_t *)p->pNtk->pManFunc, pNew, Abc_ObjFromLit(p->pNtk, iLit) );
            else
                pNew = Abc_AigXor( (Abc_Aig_t *)p->pNtk->pManFunc, pNew, Abc_ObjFromLit(p->pNtk, iLit) );
            Vec_PtrWriteEntry( vRepl, ObjId, pNew );
            p->nCountGates++;
        }
    }

    if ( p->fVerbose )
        printf( "Total gates collected = %d.  Total gates constructed = %d.\n", p->nFoundGates, p->nCountGates );

    // create map of originals
    vMap2Repl = Vec_IntStartFull( Abc_NtkObjNumMax(p->pNtk) );
    Vec_PtrForEachEntry( Abc_Obj_t *, vOrig, pObj, i )
    {
//        printf( "Replacing %d by %d.\n", Abc_ObjId(pObj), Abc_ObjToLit((Abc_Obj_t *)Vec_PtrEntry(vRepl, i)) );
        Vec_IntWriteEntry( vMap2Repl, Abc_ObjId(pObj), Abc_ObjToLit((Abc_Obj_t *)Vec_PtrEntry(vRepl, i)) );
    }
    Vec_PtrFree( vOrig );
    Vec_PtrFree( vRepl );

    // update fanin pointers
    Abc_NtkForEachObj( p->pNtk, pObj, i )
    {
        if ( Abc_ObjIsCo(pObj) || Abc_ObjIsNode(pObj) )
        {
            iLit = Vec_IntEntry( vMap2Repl, Abc_ObjFaninId0(pObj) );
            if ( iLit >= 0 )
            {
                if ( iLit == iLitConst1 && fAnd )
                {
                    pObj->fCompl0 ^= 1;
                    Vec_IntWriteEntry( &pObj->vFanins, 0, Abc_Lit2Var(iLitConst1) );
                }
                else
                {
                    pObj->fCompl0 ^= Abc_LitIsCompl(iLit);
                    Vec_IntWriteEntry( &pObj->vFanins, 0, Abc_Lit2Var(iLit) );
                }
            }
        }
        if ( Abc_ObjIsNode(pObj) )
        {
            iLit = Vec_IntEntry( vMap2Repl, Abc_ObjFaninId1(pObj) );
            if ( iLit >= 0 )
            {
                if ( iLit == iLitConst1 && fAnd )
                {
                    pObj->fCompl1 ^= 1;
                    Vec_IntWriteEntry( &pObj->vFanins, 1, Abc_Lit2Var(iLitConst1) );
                }
                else
                {
                    pObj->fCompl1 ^= Abc_LitIsCompl(iLit);
                    Vec_IntWriteEntry( &pObj->vFanins, 1, Abc_Lit2Var(iLit) );
                }
            }
        }
    }
    Vec_IntFree( vMap2Repl );

//    pNtk = Abc_NtkRestrash( p->pNtk, 1 );
    if ( fAnd )
        pNtk = Abc_NtkBalance( p->pNtk, 0, 0, 1 );
    else
        pNtk = Abc_NtkBalanceExor( p->pNtk, 1, 0 );
    return pNtk;
}